

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
despot::option::Parser::StoreOptionAction::StoreOptionAction
          (StoreOptionAction *this,Parser *parser_,Option *options_,Option *buffer_,int bufmax_)

{
  Option *pOVar1;
  bool bVar2;
  int local_30;
  int bufidx;
  int bufmax__local;
  Option *buffer__local;
  Option *options__local;
  Parser *parser__local;
  StoreOptionAction *this_local;
  
  Action::Action(&this->super_Action);
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__StoreOptionAction_0026eee8;
  this->parser = parser_;
  this->options = options_;
  this->buffer = buffer_;
  this->bufmax = bufmax_;
  local_30 = 0;
  while( true ) {
    if ((this->bufmax < 0) || (bVar2 = false, local_30 < this->bufmax)) {
      pOVar1 = Option::operator_cast_to_Option_(this->buffer + local_30);
      bVar2 = pOVar1 != (Option *)0x0;
    }
    if (!bVar2) break;
    local_30 = local_30 + 1;
  }
  this->parser->op_count = local_30;
  return;
}

Assistant:

StoreOptionAction(Parser& parser_, Option options_[], Option buffer_[],
		int bufmax_) :
		parser(parser_),
		options(options_),
		buffer(buffer_),
		bufmax(bufmax_) {
		// find first empty slot in buffer (if any)
		int bufidx = 0;
		while ((bufmax < 0 || bufidx < bufmax) && buffer[bufidx])
			++bufidx;

		// set parser's optionCount
		parser.op_count = bufidx;
	}